

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIterativeSolverLS.cpp
# Opt level: O2

void Eigen::internal::
     generic_product_impl<chrono::ChMatrixSPMV,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::SparseShape,Eigen::DenseShape,7>
     ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
               (Matrix<double,__1,_1,_0,__1,_1> *dst,ChMatrixSPMV *lhs,
               Matrix<double,__1,_1,_0,__1,_1> *rhs,Scalar *alpha)

{
  ChMatrixSPMV lhs_;
  undefined1 auStack_38 [16];
  double *local_28;
  
  if ((*alpha == 1.0) && (!NAN(*alpha))) {
    chrono::ChMatrixSPMV::ChMatrixSPMV((ChMatrixSPMV *)auStack_38,lhs);
    (*(*(_func_int ***)auStack_38._8_8_)[0x17])
              (auStack_38._8_8_,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_28,rhs
              );
    MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)dst,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_28);
    handmade_aligned_free(local_28);
    return;
  }
  __assert_fail("alpha == Scalar(1) && \"scaling is not implemented\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChIterativeSolverLS.cpp"
                ,0x95,
                "static void Eigen::internal::generic_product_impl<chrono::ChMatrixSPMV, Eigen::Matrix<double, -1, 1>, Eigen::SparseShape, Eigen::DenseShape, 7>::scaleAndAddTo(Dest &, const chrono::ChMatrixSPMV &, const Rhs &, const Scalar &) [Lhs = chrono::ChMatrixSPMV, Rhs = Eigen::Matrix<double, -1, 1>, LhsShape = Eigen::SparseShape, RhsShape = Eigen::DenseShape, ProductType = 7, Dest = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

static void scaleAndAddTo(Dest& dst, const chrono::ChMatrixSPMV& lhs, const Rhs& rhs, const Scalar& alpha) {
        assert(alpha == Scalar(1) && "scaling is not implemented");
        EIGEN_ONLY_USED_FOR_DEBUG(alpha);

        // Hack to allow calling ChSystemDescriptor::SystemProduct
        auto lhs_ = const_cast<chrono::ChMatrixSPMV&>(lhs);

        lhs_.sysd()->SystemProduct(lhs_.vect(), rhs);
        dst += lhs_.vect();
    }